

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor.c
# Opt level: O3

_Bool cn_cbor_array_replace(cn_cbor *cb_array,cn_cbor *cb_value,int index,cn_cbor_errback *errp)

{
  _Bool _Var1;
  cn_cbor *pcVar2;
  int iVar3;
  cn_cbor *pcVar4;
  
  if ((cb_value == (cn_cbor *)0x0 || cb_array == (cn_cbor *)0x0) ||
     (cb_array->type != CN_CBOR_ARRAY)) {
    if (errp == (cn_cbor_errback *)0x0) {
      return false;
    }
    errp->err = CN_CBOR_ERR_INVALID_PARAMETER;
    return false;
  }
  if (index == 0) {
    if (cb_array->length < 1) {
      _Var1 = cn_cbor_array_append(cb_array,cb_value,errp);
      return _Var1;
    }
    pcVar4 = cb_array->first_child;
    cb_value->parent = cb_array;
    cb_value->next = pcVar4->next;
    if (cb_array->last_child == pcVar4) {
      cb_array->last_child = cb_value;
    }
    cb_array->first_child = cb_value;
    pcVar4->next = (cn_cbor *)0x0;
    pcVar4->parent = (cn_cbor *)0x0;
  }
  else {
    pcVar2 = cb_array->first_child;
    if (pcVar2 == (cn_cbor *)0x0) {
      if (errp == (cn_cbor_errback *)0x0) {
        pcVar2 = (cn_cbor *)calloc(1,0x38);
        if (pcVar2 == (cn_cbor *)0x0) {
          return false;
        }
      }
      else {
        errp->err = CN_CBOR_NO_ERROR;
        pcVar2 = (cn_cbor *)calloc(1,0x38);
        if (pcVar2 == (cn_cbor *)0x0) {
LAB_001f7dee:
          errp->err = CN_CBOR_ERR_OUT_OF_MEMORY;
          return false;
        }
      }
      cb_array->last_child = pcVar2;
      cb_array->first_child = pcVar2;
      pcVar2->parent = cb_array;
      cb_array->length = 1;
      pcVar2->type = CN_CBOR_INVALID;
    }
    if (1 < index) {
      iVar3 = index + -1;
      pcVar4 = pcVar2;
      do {
        pcVar2 = pcVar4->next;
        if (pcVar2 == (cn_cbor *)0x0) {
          if (errp == (cn_cbor_errback *)0x0) {
            pcVar2 = (cn_cbor *)calloc(1,0x38);
            if (pcVar2 == (cn_cbor *)0x0) {
              return false;
            }
          }
          else {
            errp->err = CN_CBOR_NO_ERROR;
            pcVar2 = (cn_cbor *)calloc(1,0x38);
            if (pcVar2 == (cn_cbor *)0x0) goto LAB_001f7dee;
          }
          pcVar2->type = CN_CBOR_INVALID;
          pcVar4->next = pcVar2;
          pcVar2->parent = cb_array;
          cb_array->last_child = pcVar2;
          cb_array->length = cb_array->length + 1;
          pcVar2 = pcVar4->next;
        }
        iVar3 = iVar3 + -1;
        pcVar4 = pcVar2;
      } while (iVar3 != 0);
    }
    pcVar4 = pcVar2->next;
    if (pcVar4 == (cn_cbor *)0x0) {
      pcVar2->next = cb_value;
      cb_value->parent = cb_array;
      cb_array->last_child = cb_value;
      cb_array->length = cb_array->length + 1;
      return true;
    }
    cb_value->next = pcVar4->next;
    pcVar2->next = cb_value;
    cb_value->parent = cb_array;
    if (cb_array->last_child == pcVar4) {
      cb_array->last_child = cb_value;
    }
    pcVar4->next = (cn_cbor *)0x0;
    pcVar4->parent = (cn_cbor *)0x0;
  }
  cn_cbor_free(pcVar4);
  return true;
}

Assistant:

bool cn_cbor_array_replace(cn_cbor * cb_array, cn_cbor * cb_value, int index, CBOR_CONTEXT_COMMA cn_cbor_errback *errp)
{
	int i;
	cn_cbor * cb_temp;
	cn_cbor * cb_temp2;

	if (!cb_array || !cb_value || cb_array->type != CN_CBOR_ARRAY) {
		if (errp != NULL) errp->err = CN_CBOR_ERR_INVALID_PARAMETER;
		return false;
	}

	if (index == 0) {
		if (cb_array->length > 0) {
			cb_temp = cb_array->first_child;

			cb_value->parent = cb_array;
			cb_value->next = cb_temp->next;
			if (cb_array->last_child == cb_temp) {
				cb_array->last_child = cb_value;
			}
			cb_array->first_child = cb_value;
			cb_temp->parent = NULL;
			cb_temp->next = NULL;
			cn_cbor_free(cb_temp CBOR_CONTEXT_PARAM);
			return true;
		}
		return cn_cbor_array_append(cb_array, cb_value, errp);
	}

	if (cb_array->first_child == NULL) {
		INIT_CB(cb_temp2);
		cb_array->first_child = cb_array->last_child = cb_temp2;
		cb_temp2->parent = cb_array;
		cb_array->length = 1;
		cb_temp2->type = CN_CBOR_INVALID;
	}

	cb_temp = cb_array->first_child;
	for (i = 1; i < index; i++) {
		if (cb_temp->next == NULL) {
			INIT_CB(cb_temp2);
			cb_temp2->type = CN_CBOR_INVALID;
			cb_temp->next = cb_temp2;
			cb_temp2->parent = cb_array;
			cb_array->last_child = cb_temp2;
			cb_array->length += 1;
		}

		cb_temp = cb_temp->next;
	}

	if (cb_temp->next == NULL) {
		cb_temp->next = cb_value;
		cb_value->parent = cb_array;
		cb_array->last_child = cb_value;
		cb_array->length += 1;
		return true;
	}

	cb_temp2 = cb_temp->next;
	cb_value->next = cb_temp2->next;
	cb_temp->next = cb_value;
	cb_value->parent = cb_array;
	if (cb_array->last_child == cb_temp2) {
		cb_array->last_child = cb_value;
	}

	cb_temp2->next = NULL;
	cb_temp2->parent = NULL;
	cn_cbor_free(cb_temp2 CBOR_CONTEXT_PARAM);

	return true;
}